

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVariableManagerGL.hpp
# Opt level: O2

IDeviceObject * __thiscall
Diligent::ShaderVariableManagerGL::TextureBindInfo::Get(TextureBindInfo *this,Uint32 ArrayIndex)

{
  ShaderResourceCacheGL *this_00;
  PipelineResourceDesc *pPVar1;
  ResourceAttribs *pRVar2;
  CachedResourceView *pCVar3;
  char (*in_RCX) [28];
  string msg;
  string local_38;
  
  pPVar1 = ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
           ::GetDesc((ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
                      *)this);
  if (pPVar1->ArraySize <= ArrayIndex) {
    FormatString<char[26],char[28]>
              (&local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"ArrayIndex < Desc.ArraySize",in_RCX);
    DebugAssertionFailed
              (local_38._M_dataplus._M_p,"Get",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/include/ShaderVariableManagerGL.hpp"
               ,0x96);
    std::__cxx11::string::~string((string *)&local_38);
  }
  this_00 = (((this->super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>).
              super_ShaderVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo,_Diligent::ShaderVariableManagerGL,_Diligent::IShaderResourceVariable>
             .m_ParentManager)->super_ShaderVariableManagerBase<Diligent::EngineGLImplTraits,_void>)
            .m_ResourceCache;
  pRVar2 = GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>::GetAttribs
                     (&this->
                       super_GLVariableBase<Diligent::ShaderVariableManagerGL::TextureBindInfo>);
  pCVar3 = ShaderResourceCacheGL::GetConstTexture(this_00,ArrayIndex + pRVar2->CacheOffset);
  return (pCVar3->pView).m_pObject;
}

Assistant:

Get(Uint32 ArrayIndex) const override final
        {
            const auto& Desc = GetDesc();
            VERIFY_EXPR(ArrayIndex < Desc.ArraySize);
            const auto& Tex = m_ParentManager.m_ResourceCache.GetConstTexture(GetAttribs().CacheOffset + ArrayIndex);
            return Tex.pView;
        }